

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roots.hpp
# Opt level: O3

PositiveSet<double,_4UL> *
ruckig::roots::solve_quart_monic
          (PositiveSet<double,_4UL> *__return_storage_ptr__,double a,double b,double c,double d)

{
  size_t sVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  
  (__return_storage_ptr__->super_Set<double,_4UL>).size = 0;
  if (2.220446049250313e-16 <= ABS(d)) {
LAB_00143bd0:
    dVar4 = a * c + d * -4.0;
    dVar5 = b / -3.0;
    dVar9 = dVar5 * dVar5;
    dVar10 = dVar4 / -3.0 + dVar9;
    dVar9 = (((dVar9 + dVar9) - dVar4) * dVar5 + b * 4.0 * d + (-a * a * d - c * c)) * 0.5;
    dVar4 = dVar10 * dVar10 * dVar10;
    if (dVar4 <= dVar9 * dVar9) {
      dVar4 = dVar9 * dVar9 - dVar4;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar4 = cbrt(ABS(dVar9) + dVar4);
      dVar6 = (double)(~-(ulong)(dVar9 < 0.0) & (ulong)-dVar4 | -(ulong)(dVar9 < 0.0) & (ulong)dVar4
                      );
      dVar9 = (double)(~-(ulong)(-dVar4 == dVar4) & (ulong)(dVar10 / dVar6));
      dVar10 = dVar6 + dVar9;
      dVar4 = dVar10 - dVar5;
      if (ABS((dVar6 - dVar9) * 1.7320508075688772 * 0.5) < 2.220446049250313e-16) {
        dVar9 = dVar10 * -0.5 - dVar5;
        dVar5 = dVar9;
        goto LAB_00143e69;
      }
    }
    else {
      if (dVar10 < 0.0) {
        dVar6 = sqrt(dVar10);
      }
      else {
        dVar6 = SQRT(dVar10);
      }
      dVar9 = dVar9 / (dVar10 * dVar6);
      dVar4 = -1.0;
      if (-1.0 <= dVar9) {
        dVar4 = dVar9;
      }
      uVar2 = 0;
      uVar3 = 0x3ff00000;
      if (dVar4 <= 1.0) {
        uVar2 = SUB84(dVar4,0);
        uVar3 = (undefined4)((ulong)dVar4 >> 0x20);
      }
      dVar4 = acos((double)CONCAT44(uVar3,uVar2));
      dVar10 = cos(dVar4 / 3.0);
      dVar10 = dVar10 * dVar6 * -2.0;
      dVar9 = sin(dVar4 / 3.0);
      dVar4 = dVar10 - dVar5;
      dVar6 = dVar9 * dVar6 * -2.0 * 0.8660254037844386;
      dVar10 = dVar10 * -0.5;
      dVar9 = (dVar10 + dVar6) - dVar5;
      dVar5 = (dVar10 + -dVar6) - dVar5;
LAB_00143e69:
      dVar4 = (double)(~-(ulong)(ABS(dVar4) < ABS(dVar5)) & (ulong)dVar4 |
                      (ulong)dVar5 & -(ulong)(ABS(dVar4) < ABS(dVar5)));
      if (ABS(dVar4) < ABS(dVar9)) {
        dVar4 = dVar9;
      }
    }
    dVar5 = dVar4 * dVar4 + d * -4.0;
    if (2.220446049250313e-16 <= ABS(dVar5)) {
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar9 = (dVar4 - dVar5) * 0.5;
      dVar5 = (dVar4 + dVar5) * 0.5;
      dVar4 = dVar5 - dVar9;
      auVar7._0_8_ = -a * dVar9 + c;
      auVar7._8_8_ = a * dVar5 + -c;
      auVar8._8_4_ = SUB84(dVar4,0);
      auVar8._0_8_ = dVar4;
      auVar8._12_4_ = (int)((ulong)dVar4 >> 0x20);
      auVar8 = divpd(auVar7,auVar8);
      a = auVar8._0_8_;
      dVar4 = auVar8._8_8_;
    }
    else {
      dVar5 = dVar4 * 0.5;
      dVar10 = a * a + (b - dVar4) * -4.0;
      dVar9 = dVar5;
      if (2.220446049250313e-16 <= ABS(dVar10)) {
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        dVar4 = dVar10 + a;
        a = (a - dVar10) * 0.5;
        dVar4 = dVar4 * 0.5;
      }
      else {
        a = a * 0.5;
        dVar4 = a;
      }
    }
    dVar5 = dVar4 * dVar4 + dVar5 * -4.0;
    if (3.552713678800501e-15 <= ABS(dVar5)) {
      if (dVar5 <= 0.0) goto LAB_00144090;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar10 = (-dVar4 - dVar5) * 0.5;
      if (0.0 <= dVar10) {
        (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[0] = dVar10;
        (__return_storage_ptr__->super_Set<double,_4UL>).size = 1;
      }
      sVar1 = (size_t)(0.0 <= dVar10);
      dVar4 = (dVar5 - dVar4) * 0.5;
      if (0.0 <= dVar4) {
        (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[sVar1] = dVar4;
        sVar1 = sVar1 + 1;
        goto LAB_0014411b;
      }
    }
    else if (dVar4 * -0.5 < 0.0) {
LAB_00144090:
      sVar1 = 0;
    }
    else {
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[0] = dVar4 * -0.5;
      sVar1 = 1;
LAB_0014411b:
      (__return_storage_ptr__->super_Set<double,_4UL>).size = sVar1;
    }
    dVar4 = a * a + dVar9 * -4.0;
    if (3.552713678800501e-15 <= ABS(dVar4)) {
      if (dVar4 <= 0.0) {
        return __return_storage_ptr__;
      }
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar5 = (-a - dVar4) * 0.5;
      if (0.0 <= dVar5) {
        (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[sVar1] = dVar5;
        sVar1 = sVar1 + 1;
        (__return_storage_ptr__->super_Set<double,_4UL>).size = sVar1;
      }
LAB_001441fa:
      dVar4 = (dVar4 - a) * 0.5;
    }
    else {
      dVar4 = a * -0.5;
    }
    if (dVar4 < 0.0) {
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[sVar1] = dVar4;
    sVar1 = sVar1 + 1;
  }
  else {
    if (2.220446049250313e-16 <= ABS(c)) {
      if ((2.220446049250313e-16 <= ABS(a)) || (2.220446049250313e-16 <= ABS(b))) goto LAB_00143bd0;
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[0] = 0.0;
      (__return_storage_ptr__->super_Set<double,_4UL>).size = 1;
      dVar4 = cbrt(c);
      if (0.0 < dVar4) {
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[1] = -dVar4;
    }
    else {
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[0] = 0.0;
      (__return_storage_ptr__->super_Set<double,_4UL>).size = 1;
      dVar4 = a * a + b * -4.0;
      if (2.220446049250313e-16 <= ABS(dVar4)) {
        if (dVar4 <= 0.0) {
          return __return_storage_ptr__;
        }
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        dVar5 = (-a - dVar4) * 0.5;
        sVar1 = 1;
        if (0.0 <= dVar5) {
          (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[1] = dVar5;
          (__return_storage_ptr__->super_Set<double,_4UL>).size = 2;
          sVar1 = 2;
        }
        goto LAB_001441fa;
      }
      if (a * -0.5 < 0.0) {
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->super_Set<double,_4UL>).data._M_elems[1] = a * -0.5;
    }
    sVar1 = 2;
  }
  (__return_storage_ptr__->super_Set<double,_4UL>).size = sVar1;
  return __return_storage_ptr__;
}

Assistant:

inline PositiveSet<double, 4> solve_quart_monic(double a, double b, double c, double d) {
    PositiveSet<double, 4> roots;

    if (std::abs(d) < DBL_EPSILON) {
        if (std::abs(c) < DBL_EPSILON) {
            roots.insert(0.0);

            const double D = a * a - 4 * b;
            if (std::abs(D) < DBL_EPSILON) {
                roots.insert(-a / 2);
            } else if (D > 0.0) {
                const double sqrtD = std::sqrt(D);
                roots.insert((-a - sqrtD) / 2);
                roots.insert((-a + sqrtD) / 2);
            }
            return roots;
        }

        if (std::abs(a) < DBL_EPSILON && std::abs(b) < DBL_EPSILON) {
            roots.insert(0.0);
            roots.insert(-std::cbrt(c));
            return roots;
        }
    }

    const double a3 = -b;
    const double b3 = a * c - 4 * d;
    const double c3 = -a * a * d - c * c + 4 * b * d;

    std::array<double, 3> x3;
    const int number_zeroes = solve_resolvent(x3, a3, b3, c3);

    double y = x3[0];
    // Choosing Y with maximal absolute value.
    if (number_zeroes != 1) {
        if (std::abs(x3[1]) > std::abs(y)) {
            y = x3[1];
        }
        if (std::abs(x3[2]) > std::abs(y)) {
            y = x3[2];
        }
    }

    double q1, q2, p1, p2;

    double D = y * y - 4 * d;
    if (std::abs(D) < DBL_EPSILON) {
        q1 = q2 = y / 2;
        D = a * a - 4 * (b - y);
        if (std::abs(D) < DBL_EPSILON) {
            p1 = p2 = a / 2;
        } else {
            const double sqrtD = std::sqrt(D);
            p1 = (a + sqrtD) / 2;
            p2 = (a - sqrtD) / 2;
        }
    } else {
        const double sqrtD = std::sqrt(D);
        q1 = (y + sqrtD) / 2;
        q2 = (y - sqrtD) / 2;
        p1 = (a * q1 - c) / (q1 - q2);
        p2 = (c - a * q2) / (q1 - q2);
    }

    constexpr double eps {16 * DBL_EPSILON};

    D = p1 * p1 - 4 * q1;
    if (std::abs(D) < eps) {
        roots.insert(-p1 / 2);
    } else if (D > 0.0) {
        const double sqrtD = std::sqrt(D);
        roots.insert((-p1 - sqrtD) / 2);
        roots.insert((-p1 + sqrtD) / 2);
    }

    D = p2 * p2 - 4 * q2;
    if (std::abs(D) < eps) {
        roots.insert(-p2 / 2);
    } else if (D > 0.0) {
        const double sqrtD = std::sqrt(D);
        roots.insert((-p2 - sqrtD) / 2);
        roots.insert((-p2 + sqrtD) / 2);
    }

    return roots;
}